

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void ** __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::CreateEmptyTable(InnerMap *this,size_type n)

{
  LogMessage *pLVar1;
  void **__s;
  void **result;
  LogMessage local_a0;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  size_type local_18;
  size_type n_local;
  InnerMap *this_local;
  
  local_51 = 0;
  local_18 = n;
  n_local = (size_type)this;
  if (n < 8) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x432);
    local_51 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: n >= kMinTableSize: ");
    internal::LogFinisher::operator=(local_65,pLVar1);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  result._7_1_ = 0;
  if ((local_18 & local_18 - 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x433);
    result._7_1_ = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (n & (n - 1)) == (0u): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&result + 6),pLVar1);
  }
  if ((result._7_1_ & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a0);
  }
  __s = Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::Alloc<void*>
                  ((InnerMap *)this,local_18);
  memset(__s,0,local_18 << 3);
  return __s;
}

Assistant:

void** CreateEmptyTable(size_type n) {
      GOOGLE_DCHECK(n >= kMinTableSize);
      GOOGLE_DCHECK_EQ(n & (n - 1), 0u);
      void** result = Alloc<void*>(n);
      memset(result, 0, n * sizeof(result[0]));
      return result;
    }